

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O0

int udp_options_test(sockaddr *addr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uv_loop_t *puVar5;
  int local_f4;
  int r;
  int i;
  uv_udp_t h;
  uv_loop_t *loop;
  sockaddr *addr_local;
  
  h.write_completed_queue[1] = uv_default_loop();
  iVar1 = uv_udp_init((uv_loop_t *)h.write_completed_queue[1],(uv_udp_t *)&r);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
            ,0x27,"r == 0");
    abort();
  }
  uv_unref((uv_handle_t *)&r);
  iVar1 = uv_udp_bind((uv_udp_t *)&r,addr,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
            ,0x2c,"r == 0");
    abort();
  }
  iVar1 = uv_udp_set_broadcast((uv_udp_t *)&r,1);
  iVar2 = uv_udp_set_broadcast((uv_udp_t *)&r,1);
  iVar3 = uv_udp_set_broadcast((uv_udp_t *)&r,0);
  iVar4 = uv_udp_set_broadcast((uv_udp_t *)&r,0);
  if (iVar4 != 0 || (iVar3 != 0 || (iVar2 != 0 || iVar1 != 0))) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
            ,0x32,"r == 0");
    abort();
  }
  for (local_f4 = 1; local_f4 < 0x100; local_f4 = local_f4 + 1) {
    iVar1 = uv_udp_set_ttl((uv_udp_t *)&r,local_f4);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
              ,0x3d,"r == 0");
      abort();
    }
  }
  for (local_f4 = 0; local_f4 < 3; local_f4 = local_f4 + 1) {
    iVar1 = uv_udp_set_ttl((uv_udp_t *)&r,udp_options_test::invalid_ttls[local_f4]);
    if (iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
              ,0x43,"r == UV_EINVAL");
      abort();
    }
  }
  iVar1 = uv_udp_set_multicast_loop((uv_udp_t *)&r,1);
  iVar2 = uv_udp_set_multicast_loop((uv_udp_t *)&r,1);
  iVar3 = uv_udp_set_multicast_loop((uv_udp_t *)&r,0);
  iVar4 = uv_udp_set_multicast_loop((uv_udp_t *)&r,0);
  if (iVar4 != 0 || (iVar3 != 0 || (iVar2 != 0 || iVar1 != 0))) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
            ,0x4a,"r == 0");
    abort();
  }
  for (local_f4 = 0; local_f4 < 0x100; local_f4 = local_f4 + 1) {
    iVar1 = uv_udp_set_multicast_ttl((uv_udp_t *)&r,local_f4);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
              ,0x4f,"r == 0");
      abort();
    }
  }
  iVar1 = uv_udp_set_multicast_ttl((uv_udp_t *)&r,0x100);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
            ,0x54,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_run((uv_loop_t *)h.write_completed_queue[1],UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
            ,0x58,"r == 0");
    abort();
  }
  puVar5 = uv_default_loop();
  close_loop(puVar5);
  puVar5 = uv_default_loop();
  iVar1 = uv_loop_close(puVar5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-options.c"
            ,0x5a,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

static int udp_options_test(const struct sockaddr* addr) {
  static int invalid_ttls[] = { -1, 0, 256 };
  uv_loop_t* loop;
  uv_udp_t h;
  int i, r;

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h); /* don't keep the loop alive */

  r = uv_udp_bind(&h, addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 0);
  r |= uv_udp_set_broadcast(&h, 0);
  ASSERT(r == 0);

  /* values 1-255 should work */
  for (i = 1; i <= 255; i++) {
    r = uv_udp_set_ttl(&h, i);
#if defined(__MVS__)
    if (addr->sa_family == AF_INET6)
      ASSERT(r == 0);
    else
      ASSERT(r == UV_ENOTSUP);
#else
    ASSERT(r == 0);
#endif
  }

  for (i = 0; i < (int) ARRAY_SIZE(invalid_ttls); i++) {
    r = uv_udp_set_ttl(&h, invalid_ttls[i]);
    ASSERT(r == UV_EINVAL);
  }

  r = uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 0);
  r |= uv_udp_set_multicast_loop(&h, 0);
  ASSERT(r == 0);

  /* values 0-255 should work */
  for (i = 0; i <= 255; i++) {
    r = uv_udp_set_multicast_ttl(&h, i);
    ASSERT(r == 0);
  }

  /* anything >255 should fail */
  r = uv_udp_set_multicast_ttl(&h, 256);
  ASSERT(r == UV_EINVAL);
  /* don't test ttl=-1, it's a valid value on some platforms */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}